

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

int __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::remove(Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
         *this,char *__filename)

{
  hugeint_t *this_00;
  hugeint_t *this_01;
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *pNVar4;
  long in_RDX;
  char *__filename_00;
  long lVar5;
  bool bVar6;
  bool bVar7;
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *pNVar3;
  
  this_00 = (hugeint_t *)(in_RDX + 8);
  this_01 = &(this->_value).second;
  cVar1 = duckdb::hugeint_t::operator<(this_00,this_01);
  if (cVar1 == '\0') {
    bVar7 = __filename == (char *)0xffffffffffffffff;
    if (bVar7) {
      pNVar3 = (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                *)0x0;
      iVar2 = -1;
    }
    else {
      lVar5 = (long)__filename << 4;
      __filename_00 = __filename;
      do {
        pNVar3 = *(Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                   **)((long)&((this->_nodeRefs)._nodes.
                               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->pNode + lVar5);
        if (pNVar3 != (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                       *)0x0) {
          iVar2 = remove(pNVar3,__filename_00);
          pNVar3 = (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                    *)CONCAT44(extraout_var,iVar2);
          if (pNVar3 != (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                         *)0x0) {
            pNVar4 = _adjRemoveRefs(this,(size_t)__filename_00,pNVar3);
            goto LAB_004eef85;
          }
        }
        lVar5 = lVar5 + -0x10;
        pNVar4 = (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                  *)(__filename_00 + -1);
        bVar7 = pNVar4 == (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                           *)0xffffffffffffffff;
        bVar6 = __filename_00 != (char *)0x0;
        __filename_00 = __filename_00 + -1;
      } while (bVar6);
      pNVar3 = (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                *)0x0;
LAB_004eef85:
      iVar2 = (int)pNVar4;
    }
    if (!bVar7) {
      return iVar2;
    }
  }
  else {
    pNVar3 = (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
              *)0x0;
  }
  if ((((__filename == (char *)0x0) &&
       (pNVar3 == (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                   *)0x0)) && (cVar1 = duckdb::hugeint_t::operator<(this_00,this_01), cVar1 == '\0')
      ) && (cVar1 = duckdb::hugeint_t::operator<(this_01,this_00), cVar1 == '\0')) {
    (this->_nodeRefs)._swapLevel = 0;
    return (int)this;
  }
  return 0;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::remove(size_t call_level,
                         const T &value) {
    assert(_nodeRefs.height());
    assert(_nodeRefs.noNodePointerMatches(this));

    Node<T, _Compare> *pNode = nullptr;
    // Effectively: if (value >= _value) {
    if (!_compare(value, _value)) {
        for (size_t level = call_level + 1; level-- > 0;) {
            if (_nodeRefs[level].pNode) {
                // Make progress to the right
                pNode = _nodeRefs[level].pNode->remove(level, value);
                if (pNode) {
                    return _adjRemoveRefs(level, pNode);
                }
            }
            // Make progress down
        }
    }
    if (! pNode) { // Base case
        // We only admit to being the node to remove if the caller is
        // approaching us from level 0. It is entirely likely that
        // the same (or an other) caller can see us at a higher level
        // but the recursion stack will not have been set up in the correct
        // step wise fashion so that the lower level references will
        // not be swapped.
        // Effectively: if (call_level == 0 && value == _value) {
        if (call_level == 0 && !_compare(value, _value) && !_compare(_value, value)) {
            _nodeRefs.resetSwapLevel();
            return this;
        }
    }
    assert(pNode == nullptr);
    return nullptr;
}